

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  string shader_source;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"    float[][] x = mat4(0);\n\n","");
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,&local_40);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b4b0b2_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&local_60);
    goto switchD_00b4b0b2_caseD_0;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar1 = &set_tesseation_abi_cxx11_;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xa53);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&local_60,*puVar1);
switchD_00b4b0b2_caseD_0:
  std::__cxx11::string::_M_append((char *)&local_60,shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)tested_shader_type,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedArrays3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string("    float[][] x = mat4(0);\n\n");

	std::string shader_source = shader_start + base_variable_string;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);
}